

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cxx
# Opt level: O2

int __thiscall Display::plot(Display *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  pointer pPVar6;
  bool bVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  allocator<char> local_201;
  string *local_200;
  string *local_1f8;
  string *local_1f0;
  string *local_1e8;
  string *local_1e0;
  string *local_1d8;
  string *local_1d0;
  char *local_1c8 [4];
  ostringstream command;
  
  if (this->pFile == (ofstream *)0x0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"instruction file error");
    std::endl<char,std::char_traits<char>>(poVar5);
    iVar4 = 1;
  }
  else {
    poVar5 = std::operator<<((ostream *)this->pFile,"set title ");
    poVar5 = std::operator<<(poVar5,(string *)&this->sTitle);
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)this->pFile,"set multiplot");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<(poVar5,"set grid");
    std::endl<char,std::char_traits<char>>(poVar5);
    local_1d0 = (string *)&this->sXTicFont;
    local_1d8 = (string *)&this->sYTicFont;
    local_1e0 = (string *)&this->sZTicFont;
    local_1e8 = (string *)&this->sXFont;
    local_1f0 = (string *)&this->sYFont;
    local_1f8 = (string *)&this->sZFont;
    local_200 = (string *)&this->sUserSettings;
    bVar7 = true;
    uVar9 = 0;
    uVar3 = 0;
    while( true ) {
      uVar10 = (ulong)uVar9;
      pPVar6 = (this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pPVar6) / 0xf0) <= uVar10) break;
      uVar1 = pPVar6[uVar10].nMode;
      if ((uVar1 & 0x3e0) == (uVar3 & 0x3e0)) {
        pcVar8 = ", ";
        if (bVar7) goto LAB_0012af23;
        goto switchD_0012b147_caseD_1;
      }
      std::endl<char,std::char_traits<char>>((ostream *)this->pFile);
      uVar3 = (uVar1 & 0x3e0) - 0x20;
      if (uVar3 < 0x100) {
        uVar3 = uVar3 >> 3;
        iVar4 = *(int *)(&DAT_00144288 + uVar3);
        iVar2 = *(int *)(&DAT_001442a8 + uVar3);
        poVar5 = std::operator<<((ostream *)this->pFile,
                                 &DAT_00144268 + *(int *)(&DAT_00144268 + uVar3));
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<(poVar5,&DAT_00144288 + iVar4);
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<(poVar5,&DAT_001442a8 + iVar2);
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<(poVar5,"clear");
        std::endl<char,std::char_traits<char>>(poVar5);
      }
LAB_0012af23:
      poVar5 = std::operator<<((ostream *)this->pFile,"set xtics font \"");
      poVar5 = std::operator<<(poVar5,local_1d0);
      poVar5 = std::operator<<(poVar5,"\"");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)this->pFile,"set ytics font \"");
      poVar5 = std::operator<<(poVar5,local_1d8);
      poVar5 = std::operator<<(poVar5,"\"");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)this->pFile,"set ztics font \"");
      poVar5 = std::operator<<(poVar5,local_1e0);
      poVar5 = std::operator<<(poVar5,"\"");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)this->pFile,"set xlabel \"");
      poVar5 = std::operator<<(poVar5,(string *)
                                      &(this->vPlots).
                                       super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
                                       super__Vector_impl_data._M_start[uVar10].sXLabel);
      poVar5 = std::operator<<(poVar5,"\" font \"");
      poVar5 = std::operator<<(poVar5,local_1e8);
      poVar5 = std::operator<<(poVar5,"\"");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)this->pFile,"set ylabel \"");
      poVar5 = std::operator<<(poVar5,(string *)
                                      &(this->vPlots).
                                       super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
                                       super__Vector_impl_data._M_start[uVar10].sYLabel);
      poVar5 = std::operator<<(poVar5,"\" font \"");
      poVar5 = std::operator<<(poVar5,local_1f0);
      poVar5 = std::operator<<(poVar5,"\"");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)this->pFile,"set zlabel \"");
      poVar5 = std::operator<<(poVar5,(string *)
                                      &(this->vPlots).
                                       super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
                                       super__Vector_impl_data._M_start[uVar10].sZLabel);
      poVar5 = std::operator<<(poVar5,"\" font \"");
      poVar5 = std::operator<<(poVar5,local_1f8);
      poVar5 = std::operator<<(poVar5,"\"");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)this->pFile,local_200);
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)this->pFile,
                               (string *)
                               &(this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar10].sUserSettings);
      std::endl<char,std::char_traits<char>>(poVar5);
      uVar3 = uVar1 & 0x1c00;
      pcVar8 = "set logscale x";
      if (uVar3 == 0x400) {
LAB_0012b11b:
        poVar5 = std::operator<<((ostream *)this->pFile,pcVar8);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      else {
        if (uVar3 == 0x1000) {
          pcVar8 = "set logscale z";
          goto LAB_0012b11b;
        }
        if (uVar3 == 0x800) {
          pcVar8 = "set logscale y ";
          goto LAB_0012b11b;
        }
      }
      pcVar8 = "splot ";
      switch(uVar1 & 3) {
      case 0:
        pcVar8 = "plot ";
        break;
      case 2:
        poVar5 = std::operator<<((ostream *)this->pFile,"set pm3d map");
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar8 = "splot ";
        break;
      case 3:
        goto switchD_0012b147_caseD_3;
      }
switchD_0012b147_caseD_1:
      std::operator<<((ostream *)this->pFile,pcVar8);
switchD_0012b147_caseD_3:
      std::operator<<((ostream *)this->pFile,
                      (string *)
                      ((this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar10));
      if ((this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10].sUsedDimensions._M_string_length != 0) {
        poVar5 = std::operator<<((ostream *)this->pFile," using ");
        std::operator<<(poVar5,(string *)
                               &(this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar10].sUsedDimensions);
      }
      poVar5 = std::operator<<((ostream *)this->pFile," title \" ");
      poVar5 = std::operator<<(poVar5,(string *)
                                      &(this->vPlots).
                                       super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
                                       super__Vector_impl_data._M_start[uVar10].sName);
      std::operator<<(poVar5,"\" ");
      std::operator<<((ostream *)this->pFile,
                      &DAT_001442c8 + *(int *)(&DAT_001442c8 + (uVar1 & 0x1c)));
      pPVar6 = (this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pPVar6[uVar10].nLineStyle != 0) {
        poVar5 = std::operator<<((ostream *)this->pFile,"ls ");
        std::ostream::operator<<
                  (poVar5,(this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar10].nLineStyle);
        pPVar6 = (this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      if (pPVar6[uVar10].nLineWidth != 0) {
        poVar5 = std::operator<<((ostream *)this->pFile,"lw ");
        std::ostream::operator<<
                  (poVar5,(this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar10].nLineWidth);
      }
      uVar9 = uVar9 + 1;
      bVar7 = false;
      uVar3 = uVar1;
    }
    poVar5 = std::endl<char,std::char_traits<char>>((ostream *)this->pFile);
    poVar5 = std::operator<<(poVar5,"unset multiplot");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::ostream::flush();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_1c8,"",&local_201);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&command,(string *)local_1c8,_S_out)
    ;
    std::__cxx11::string::~string((string *)local_1c8);
    poVar5 = std::operator<<((ostream *)&command,"/usr/bin/gnuplot ");
    poVar5 = std::operator<<(poVar5,"-xrm \"gnuplot*background:#e0e0a0\" ");
    poVar5 = std::operator<<(poVar5,"-xrm \"gnuplot*line1Color:blue\" ");
    poVar5 = std::operator<<(poVar5,"-xrm \"gnuplot*line2Color:red\" ");
    poVar5 = std::operator<<(poVar5,"-xrm \"gnuplot*line3Color:darkgrey\" ");
    std::operator<<(poVar5,"-persist -title \"NeuroLab :: Plot\" ");
    poVar5 = std::operator<<((ostream *)&command,(string *)this);
    std::operator<<(poVar5,".gnuplot");
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    system(local_1c8[0]);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&command);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int Display::plot()
{
	// sort plot vector by plot-mode
	// not implemented yet
	if(pFile) {
		int mode = 0; // start with default mode
		int oldMode = 0; // to detect mode changes -> set different coordinates for subplots
		bool firstPlot = true; // the first plot get a different command
		
		(*pFile) << "set title " << sTitle << endl;
		(*pFile) << "set multiplot" << endl << "set grid" << endl;
		for(uint i=0; i<vPlots.size(); i++) {
			mode = vPlots[i].nMode;
			
			// set new position when changed
			if( (mode & DSP_POSITION_MASK) != (oldMode & DSP_POSITION_MASK) ) {
				(*pFile) << endl;
				switch( mode & DSP_POSITION_MASK ) {
					case DSP_TOP_LEFT:
						(*pFile) << "unset grid" << endl
							<< "set origin 0.0,0.5" << endl
							<< "set size 0.5,0.5" << endl << "clear" << endl;
						break;
					case DSP_TOP_RIGHT:
						(*pFile) << "unset grid" << endl
							<< "set origin 0.5,0.5" << endl
							<< "set size 0.5,0.5" << endl << "clear" << endl;
						break;
					case DSP_BOTTOM_LEFT:
						(*pFile) << "unset grid" << endl
							<< "set origin 0.0,0.0" << endl
							<< "set size 0.5,0.5" << endl << "clear" << endl;
						break;
					case DSP_BOTTOM_RIGHT:
						(*pFile) << "unset grid" << endl
							<< "set origin 0.5,0.0" << endl
							<< "set size 0.5,0.5" << endl << "clear" << endl;
						break;
					case DSP_TOP:
						(*pFile) << "set grid" << endl
							<< "set origin 0.0,0.5" << endl
							<< "set size 1.0,0.5" << endl << "clear" << endl;
						break;
					case DSP_BOTTOM:
						(*pFile) << "set grid" << endl
							<< "set origin 0.0,0.0" << endl
							<< "set size 1.0,0.5" << endl << "clear" << endl;
						break;
					case DSP_LEFT:
						(*pFile) << "set grid" << endl
							<< "set origin 0.0,0.0" << endl
							<< "set size 0.5,1.0" << endl << "clear" << endl;
						break;
					case DSP_RIGHT:
						(*pFile) << "set grid" << endl
							<< "set origin 0.5,0.0" << endl
							<< "set size 0.5,1.0" << endl << "clear" << endl;
						break;
				}
				firstPlot = true;
			}
			
			// append next plot
			if( firstPlot ) {
				(*pFile) << "set xtics font \"" << sXTicFont << "\"" << endl;
				(*pFile) << "set ytics font \"" << sYTicFont << "\"" << endl;
				(*pFile) << "set ztics font \"" << sZTicFont << "\"" << endl;
				(*pFile) << "set xlabel \"" << vPlots[i].sXLabel << "\" font \"" << sXFont << "\"" << endl;
				(*pFile) << "set ylabel \"" << vPlots[i].sYLabel << "\" font \"" << sYFont << "\"" << endl;
				(*pFile) << "set zlabel \"" << vPlots[i].sZLabel << "\" font \"" << sZFont << "\"" << endl;
				(*pFile) << sUserSettings << endl;
				(*pFile) << vPlots[i].sUserSettings << endl;
				switch(mode & (DSP_AXIS_MASK) ) {
					case DSP_X_AXIS_LOG:
						(*pFile) << "set logscale x" << endl;
						break;
					case DSP_Y_AXIS_LOG:
						(*pFile) << "set logscale y " << endl;
						break;
					case DSP_Z_AXIS_LOG:
						(*pFile) << "set logscale z" << endl;
				}
				switch(mode & (DSP_DIMENSION_MASK|DSP_COLOR_MASK)) {
					case DSP_3D:
						(*pFile) << "set pm3d map" << endl;
						(*pFile) << "splot ";
						break;
					case DSP_BW:;
						(*pFile) << "splot ";
						break;
					case DSP_2D:
						(*pFile) << "plot ";
				}
			} else 
				(*pFile) << ", ";
			
			(*pFile) << vPlots[i].sFunction;
			if (vPlots[i].sUsedDimensions.length() > 0)
				(*pFile) << " using " <<  vPlots[i].sUsedDimensions;
			(*pFile) <<  " title \" " << vPlots[i].sName << "\" " ;
			
			switch(mode & DSP_LINE_MASK) {
				case DSP_LINES:
					(*pFile) << "with lines "; 
					break;
				case DSP_POINTS:
					(*pFile) << "with points "; 
					break;
				case DSP_DOTS:
					(*pFile) << "with dots "; 
					break;
                case DSP_IMAGE:
                    (*pFile) << "with image ";
                    break;
                case DSP_BARS:
					(*pFile) << "with boxes "; 
					break;
				case DSP_FILLEDCURVES:
					(*pFile) << "with filledcurves y1=0";
					break;
				case DSP_LINESPOINTS:
					(*pFile) << "with linespoints ";
					break;
				case DSP_NOLINES:
					(*pFile) << " ";
			}
			if (vPlots[i].nLineStyle)
				(*pFile) << "ls " << vPlots[i].nLineStyle;
            if (vPlots[i].nLineWidth)
                (*pFile) << "lw " << vPlots[i].nLineWidth;
            firstPlot = false;
			oldMode = mode;
		}
		(*pFile) << endl << "unset multiplot" << endl;
		(*pFile) << flush;
		
        // run terminal + gnuplStyleStyleot
		ostringstream command("");
		command << GNUPLOT_EXECUTABLE
			<< "-xrm \"gnuplot*background:#e0e0a0\" "
			<< "-xrm \"gnuplot*line1Color:blue\" "
			<< "-xrm \"gnuplot*line2Color:red\" "
			<< "-xrm \"gnuplot*line3Color:darkgrey\" "
			<< "-persist -title \"NeuroLab :: Plot\" ";
//		command << "/usr/bin/gnuplot -title \"NeuroLab :: Plot\" ";
		command << sFileBase << ".gnuplot" << flush;
		system( command.str().c_str() );
		return 0;
	}
	else cout << "instruction file error" << endl;
	return 1;
}